

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

uint portInfo(snd_seq_t *seq,snd_seq_port_info_t *pinfo,uint type,int portNumber)

{
  void *pvVar1;
  snd_seq_port_info_t *psVar2;
  snd_seq_port_info_t *psVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  size_t __n;
  undefined8 uStack_50;
  void *local_48;
  uint local_40;
  uint local_3c;
  uint caps;
  uint atyp;
  int count;
  int client;
  snd_seq_client_info_t *cinfo;
  int portNumber_local;
  uint type_local;
  snd_seq_port_info_t *pinfo_local;
  snd_seq_t *seq_local;
  
  caps = 0;
  uStack_50 = 0x1113e2;
  cinfo._0_4_ = portNumber;
  cinfo._4_4_ = type;
  _portNumber_local = pinfo;
  pinfo_local = (snd_seq_port_info_t *)seq;
  lVar6 = snd_seq_client_info_sizeof();
  lVar6 = -(lVar6 + 0xfU & 0xfffffffffffffff0);
  local_48 = (void *)((long)&local_48 + lVar6);
  _count = local_48;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0x111407;
  __n = snd_seq_client_info_sizeof();
  pvVar1 = local_48;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0x111415;
  memset(pvVar1,0,__n);
  pvVar1 = _count;
  *(undefined8 *)((long)&uStack_50 + lVar6) = 0x111423;
  snd_seq_client_info_set_client(pvVar1,0xffffffff);
  do {
    do {
      psVar2 = pinfo_local;
      pvVar1 = _count;
      *(undefined8 *)((long)&uStack_50 + lVar6) = 0x111430;
      iVar4 = snd_seq_query_next_client(psVar2,pvVar1);
      pvVar1 = _count;
      if (iVar4 < 0) {
        if ((int)(uint)cinfo < 0) {
          seq_local._4_4_ = caps;
        }
        else {
          seq_local._4_4_ = 0;
        }
        return seq_local._4_4_;
      }
      *(undefined8 *)((long)&uStack_50 + lVar6) = 0x111442;
      uVar5 = snd_seq_client_info_get_client(pvVar1);
      psVar2 = _portNumber_local;
      atyp = uVar5;
    } while (uVar5 == 0);
    *(undefined8 *)((long)&uStack_50 + lVar6) = 0x111459;
    snd_seq_port_info_set_client(psVar2,uVar5);
    psVar2 = _portNumber_local;
    *(undefined8 *)((long)&uStack_50 + lVar6) = 0x111467;
    snd_seq_port_info_set_port(psVar2,0xffffffff);
    while( true ) {
      psVar3 = pinfo_local;
      psVar2 = _portNumber_local;
      *(undefined8 *)((long)&uStack_50 + lVar6) = 0x111474;
      iVar4 = snd_seq_query_next_port(psVar3,psVar2);
      psVar2 = _portNumber_local;
      if (iVar4 < 0) break;
      *(undefined8 *)((long)&uStack_50 + lVar6) = 0x111482;
      local_3c = snd_seq_port_info_get_type(psVar2);
      psVar2 = _portNumber_local;
      if ((((local_3c & 2) != 0) || ((local_3c & 0x400) != 0)) || ((local_3c & 0x100000) != 0)) {
        *(undefined8 *)((long)&uStack_50 + lVar6) = 0x1114b5;
        local_40 = snd_seq_port_info_get_capability(psVar2);
        if ((local_40 & cinfo._4_4_) == cinfo._4_4_) {
          if (caps == (uint)cinfo) {
            return 1;
          }
          caps = caps + 1;
        }
      }
    }
  } while( true );
}

Assistant:

unsigned int portInfo( snd_seq_t *seq, snd_seq_port_info_t *pinfo, unsigned int type, int portNumber )
{
  snd_seq_client_info_t *cinfo;
  int client;
  int count = 0;
  snd_seq_client_info_alloca( &cinfo );

  snd_seq_client_info_set_client( cinfo, -1 );
  while ( snd_seq_query_next_client( seq, cinfo ) >= 0 ) {
    client = snd_seq_client_info_get_client( cinfo );
    if ( client == 0 ) continue;
    // Reset query info
    snd_seq_port_info_set_client( pinfo, client );
    snd_seq_port_info_set_port( pinfo, -1 );
    while ( snd_seq_query_next_port( seq, pinfo ) >= 0 ) {
      unsigned int atyp = snd_seq_port_info_get_type( pinfo );
      if ( ( ( atyp & SND_SEQ_PORT_TYPE_MIDI_GENERIC ) == 0 ) &&
           ( ( atyp & SND_SEQ_PORT_TYPE_SYNTH ) == 0 ) &&
           ( ( atyp & SND_SEQ_PORT_TYPE_APPLICATION ) == 0 ) ) continue;

      unsigned int caps = snd_seq_port_info_get_capability( pinfo );
      if ( ( caps & type ) != type ) continue;
      if ( count == portNumber ) return 1;
      ++count;
    }
  }

  // If a negative portNumber was used, return the port count.
  if ( portNumber < 0 ) return count;
  return 0;
}